

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr,XML_Account account)

{
  STRING_POOL *pool;
  XML_Char XVar1;
  char cVar2;
  DTD *pDVar3;
  ATTRIBUTE *pAVar4;
  DEFAULT_ATTRIBUTE *pDVar5;
  XML_Char *pXVar6;
  undefined8 *puVar7;
  byte bVar8;
  XML_Bool XVar9;
  uint uVar10;
  int iVar11;
  XML_Error XVar12;
  int iVar13;
  ELEMENT_TYPE *elementType;
  ATTRIBUTE *pAVar14;
  ATTRIBUTE_ID *pAVar15;
  XML_Char *pXVar16;
  long lVar17;
  NAMED *pNVar18;
  size_t len;
  uint64_t uVar19;
  char *pcVar20;
  NS_ATT *pNVar21;
  TAG *pTVar22;
  ulong uVar23;
  char *pcVar24;
  byte bVar25;
  byte bVar26;
  int iVar27;
  XML_Parser pXVar28;
  byte bVar29;
  ulong uVar30;
  unsigned_long uVar31;
  KEY name;
  BINDING *pBVar32;
  uint uVar33;
  XML_Parser parser_00;
  long lVar34;
  ulong uVar35;
  long lVar36;
  bool bVar37;
  XML_Parser pXVar38;
  sipkey sip_key;
  siphash local_68;
  
  pDVar3 = parser->m_dtd;
  elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar3->elementTypes,tagNamePtr->str,0);
  if (elementType == (ELEMENT_TYPE *)0x0) {
    pXVar16 = poolCopyString(&pDVar3->pool,tagNamePtr->str);
    if (pXVar16 == (XML_Char *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar3->elementTypes,pXVar16,0x28);
    if (elementType == (ELEMENT_TYPE *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    if ((parser->m_ns != '\0') && (iVar13 = setElementTypePrefix(parser,elementType), iVar13 == 0))
    {
      return XML_ERROR_NO_MEMORY;
    }
  }
  uVar33 = elementType->nDefaultAtts;
  uVar10 = (*enc->getAtts)(enc,attStr,parser->m_attsSize,parser->m_atts);
  if ((int)(uVar33 ^ 0x7fffffff) < (int)uVar10) {
    return XML_ERROR_NO_MEMORY;
  }
  iVar13 = uVar10 + uVar33;
  iVar27 = parser->m_attsSize;
  parser_00 = parser;
  if (iVar27 < iVar13) {
    if ((int)(0x7fffffef - uVar33) < (int)uVar10 || 0x7fffffef < (int)uVar33) {
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_attsSize = iVar13 + 0x10;
    pAVar14 = (ATTRIBUTE *)
              (*(parser->m_mem).realloc_fcn)(parser->m_atts,(long)iVar13 * 0x20 + 0x200);
    if (pAVar14 == (ATTRIBUTE *)0x0) {
      parser->m_attsSize = iVar27;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_atts = pAVar14;
    if (iVar27 < (int)uVar10) {
      (*enc->getAtts)(enc,attStr,uVar10,pAVar14);
    }
  }
  pAVar14 = parser->m_atts;
  uVar23 = 0;
  uVar35 = (ulong)uVar33;
  if ((int)uVar33 < 1) {
    uVar35 = uVar23;
  }
  pool = &parser->m_tempPool;
  uVar30 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar30 = uVar23;
  }
  iVar13 = 0;
  iVar27 = 0;
  for (; uVar23 != uVar30; uVar23 = uVar23 + 1) {
    pcVar24 = parser->m_atts[uVar23].name;
    iVar11 = (*enc->nameLength)(enc,pcVar24);
    pAVar15 = getAttributeId(parser,enc,pcVar24,pcVar24 + iVar11);
    parser = parser_00;
    if (pAVar15 == (ATTRIBUTE_ID *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    if (pAVar15->name[-1] != '\0') {
      if (parser->m_encoding == enc) {
        parser->m_eventPtr = parser->m_atts[uVar23].name;
        return XML_ERROR_DUPLICATE_ATTRIBUTE;
      }
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    pAVar15->name[-1] = '\x01';
    iVar11 = iVar27 + 1;
    (&pAVar14->name)[iVar27] = pAVar15->name;
    pAVar4 = parser->m_atts;
    if (pAVar4[uVar23].normalized == '\0') {
      XVar9 = '\x01';
      if (pAVar15->maybeTokenized != '\0') {
        lVar17 = 0;
        do {
          lVar36 = lVar17;
          if (uVar35 * 0x18 + 0x18 == lVar36 + 0x18) goto LAB_004e0126;
          lVar17 = lVar36 + 0x18;
        } while (pAVar15 != *(ATTRIBUTE_ID **)((long)&elementType->defaultAtts->id + lVar36));
        XVar9 = (&elementType->defaultAtts->isCdata)[lVar36];
      }
LAB_004e0126:
      parser_00 = parser;
      XVar12 = storeAttributeValue(parser,enc,XVar9,pAVar4[uVar23].valuePtr,pAVar4[uVar23].valueEnd,
                                   pool,(XML_Account)parser);
      if (XVar12 != XML_ERROR_NONE) {
        return XVar12;
      }
      (&pAVar14->name)[iVar11] = (parser->m_tempPool).start;
    }
    else {
      pXVar16 = poolStoreString(pool,enc,pAVar4[uVar23].valuePtr,pAVar4[uVar23].valueEnd);
      (&pAVar14->name)[iVar11] = pXVar16;
      parser_00 = parser;
      if (pXVar16 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
    }
    (parser->m_tempPool).start = (parser->m_tempPool).ptr;
    if (pAVar15->prefix == (PREFIX *)0x0) {
      iVar27 = iVar27 + 2;
    }
    else if (pAVar15->xmlns == '\0') {
      iVar27 = iVar27 + 2;
      iVar13 = iVar13 + 1;
      pAVar15->name[-1] = '\x02';
    }
    else {
      XVar12 = addBinding(parser,pAVar15->prefix,pAVar15,(&pAVar14->name)[iVar11],bindingsPtr);
      if (XVar12 != XML_ERROR_NONE) {
        return XVar12;
      }
    }
  }
  parser->m_nSpecifiedAtts = iVar27;
  lVar17 = -1;
  if ((elementType->idAtt == (ATTRIBUTE_ID *)0x0) ||
     (pXVar16 = elementType->idAtt->name, pXVar16[-1] == '\0')) {
LAB_004e0287:
    parser->m_idAttIndex = (int)lVar17;
  }
  else {
    for (lVar17 = 0; lVar17 < iVar27; lVar17 = lVar17 + 2) {
      if ((&pAVar14->name)[lVar17] == pXVar16) goto LAB_004e0287;
    }
  }
  for (lVar17 = 0; lVar36 = (long)iVar27, uVar35 * 0x18 - lVar17 != 0; lVar17 = lVar17 + 0x18) {
    pDVar5 = elementType->defaultAtts;
    pAVar15 = *(ATTRIBUTE_ID **)((long)&pDVar5->id + lVar17);
    pXVar16 = pAVar15->name;
    if ((pXVar16[-1] == '\0') &&
       (pXVar6 = *(XML_Char **)((long)&pDVar5->value + lVar17), pXVar6 != (XML_Char *)0x0)) {
      if (pAVar15->prefix == (PREFIX *)0x0) {
        pXVar16[-1] = '\x01';
      }
      else {
        if (pAVar15->xmlns != '\0') {
          XVar12 = addBinding(parser_00,pAVar15->prefix,pAVar15,pXVar6,bindingsPtr);
          if (XVar12 != XML_ERROR_NONE) {
            return XVar12;
          }
          goto LAB_004e02bf;
        }
        pXVar16[-1] = '\x02';
        iVar13 = iVar13 + 1;
      }
      (&pAVar14->name)[lVar36] = (char *)**(undefined8 **)((long)&pDVar5->id + lVar17);
      iVar27 = iVar27 + 2;
      (&pAVar14->valuePtr)[lVar36] = *(char **)((long)&pDVar5->value + lVar17);
    }
LAB_004e02bf:
  }
  (&pAVar14->name)[lVar36] = (char *)0x0;
  pXVar38 = parser_00;
  if (iVar13 == 0) {
    lVar17 = 0;
    goto LAB_004e03bc;
  }
  bVar29 = parser_00->m_nsAttsPower;
  if (0x1f < bVar29) {
    return XML_ERROR_NO_MEMORY;
  }
  bVar25 = bVar29;
  if (iVar13 * 2 >> (bVar29 & 0x1f) == 0) {
    uVar31 = parser_00->m_nsAttsVersion;
    iVar27 = 1 << (bVar29 & 0x1f);
    if (uVar31 == 0) goto LAB_004e07f3;
  }
  else {
    do {
      bVar26 = bVar25 + 1;
      bVar8 = bVar25 & 0x1f;
      bVar25 = bVar26;
    } while (iVar13 >> bVar8 != 0);
    parser_00->m_nsAttsPower = bVar26;
    if (bVar26 < 3) {
      parser_00->m_nsAttsPower = '\x03';
      bVar26 = 3;
    }
    else if (0x1f < bVar26) goto LAB_004e0821;
    pNVar21 = (NS_ATT *)
              (*(parser_00->m_mem).realloc_fcn)(parser_00->m_nsAtts,0x18L << (bVar26 & 0x3f));
    if (pNVar21 == (NS_ATT *)0x0) {
LAB_004e0821:
      parser_00->m_nsAttsPower = bVar29;
      return XML_ERROR_NO_MEMORY;
    }
    parser_00->m_nsAtts = pNVar21;
    iVar27 = 1 << (bVar26 & 0x1f);
LAB_004e07f3:
    uVar31 = 0xffffffff;
    lVar17 = (long)iVar27;
    pNVar21 = parser_00->m_nsAtts + lVar17;
    while( true ) {
      pNVar21 = pNVar21 + -1;
      bVar37 = lVar17 == 0;
      lVar17 = lVar17 + -1;
      if (bVar37) break;
      pNVar21->version = 0xffffffff;
    }
  }
  uVar31 = uVar31 - 1;
  parser_00->m_nsAttsVersion = uVar31;
  uVar33 = iVar27 - 1;
  for (lVar17 = 0; lVar17 < lVar36; lVar17 = lVar17 + 2) {
    name = (&pAVar14->name)[lVar17];
    if (name[-1] == '\x02') {
      copy_salt_to_sipkey(parser_00,&sip_key);
      local_68.v0._0_4_ = (uint)sip_key.k[0] ^ 0x70736575;
      local_68.v0._4_4_ = sip_key.k[0]._4_4_ ^ 0x736f6d65;
      local_68.v1._0_4_ = (uint)sip_key.k[1] ^ 0x6e646f6d;
      local_68.v1._4_4_ = sip_key.k[1]._4_4_ ^ 0x646f7261;
      local_68.v2._0_4_ = (uint)sip_key.k[0] ^ 0x6e657261;
      local_68.v2._4_4_ = sip_key.k[0]._4_4_ ^ 0x6c796765;
      local_68.v3._0_4_ = (uint)sip_key.k[1] ^ 0x79746573;
      local_68.v3._4_4_ = sip_key.k[1]._4_4_ ^ 0x74656462;
      local_68.p = local_68.buf;
      local_68.c = 0;
      name[-1] = '\0';
      pNVar18 = lookup(parser_00,&pDVar3->attributeIds,name,0);
      if (pNVar18 == (NAMED *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      if (pNVar18[1].name == (KEY)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      puVar7 = *(undefined8 **)(pNVar18[1].name + 8);
      if (puVar7 == (undefined8 *)0x0) {
        return XML_ERROR_UNBOUND_PREFIX;
      }
      lVar34 = 0;
      while( true ) {
        if (*(int *)(puVar7 + 5) <= lVar34) break;
        XVar1 = *(XML_Char *)((long)puVar7[4] + lVar34);
        pXVar16 = (pXVar38->m_tempPool).ptr;
        if (pXVar16 == (pXVar38->m_tempPool).end) {
          XVar9 = poolGrow(pool);
          if (XVar9 == '\0') {
            return XML_ERROR_NO_MEMORY;
          }
          pXVar16 = (pXVar38->m_tempPool).ptr;
        }
        (pXVar38->m_tempPool).ptr = pXVar16 + 1;
        *pXVar16 = XVar1;
        lVar34 = lVar34 + 1;
      }
      sip24_update(&local_68,(void *)puVar7[4],(long)*(int *)(puVar7 + 5));
      do {
        cVar2 = *name;
        name = name + 1;
      } while (cVar2 != ':');
      len = keylen(name);
      sip24_update(&local_68,name,len);
      pXVar28 = pXVar38;
      do {
        pXVar16 = (pXVar38->m_tempPool).ptr;
        if (pXVar16 == (pXVar38->m_tempPool).end) {
          XVar9 = poolGrow(pool);
          if (XVar9 == '\0') {
            return XML_ERROR_NO_MEMORY;
          }
          pXVar16 = (pXVar38->m_tempPool).ptr;
        }
        XVar1 = *name;
        (pXVar38->m_tempPool).ptr = pXVar16 + 1;
        *pXVar16 = XVar1;
        cVar2 = *name;
        name = name + 1;
      } while (cVar2 != '\0');
      uVar19 = sip24_final(&local_68);
      uVar10 = uVar33 & (uint)uVar19;
      pNVar21 = pXVar38->m_nsAtts;
      bVar29 = 0;
      while (pNVar21[(int)uVar10].version == uVar31) {
        if (uVar19 == pNVar21[(int)uVar10].hash) {
          for (lVar34 = 0;
              (cVar2 = (pXVar28->m_tempPool).start[lVar34], cVar2 != '\0' &&
              (cVar2 == pNVar21[(int)uVar10].uriName[lVar34])); lVar34 = lVar34 + 1) {
          }
          if (cVar2 == '\0') {
            return XML_ERROR_DUPLICATE_ATTRIBUTE;
          }
        }
        if (bVar29 == 0) {
          bVar29 = (byte)((uVar19 & ~(ulong)uVar33) >>
                         ((char)*(undefined4 *)&pXVar28->m_nsAttsPower - 1U & 0x3f)) &
                   (byte)(uVar33 >> 2) | 1;
        }
        iVar11 = 0;
        if ((int)uVar10 < (int)(uint)bVar29) {
          iVar11 = iVar27;
        }
        uVar10 = (uVar10 - bVar29) + iVar11;
      }
      parser_00 = pXVar28;
      if (pXVar28->m_ns_triplets != '\0') {
        (pXVar28->m_tempPool).ptr[-1] = pXVar28->m_namespaceSeparator;
        pcVar24 = *(char **)*puVar7;
        do {
          pcVar20 = (pXVar28->m_tempPool).ptr;
          if (pcVar20 == (pXVar28->m_tempPool).end) {
            pXVar28 = parser_00;
            XVar9 = poolGrow(pool);
            if (XVar9 == '\0') {
              return XML_ERROR_NO_MEMORY;
            }
            pcVar20 = (pXVar28->m_tempPool).ptr;
            parser_00 = pXVar28;
          }
          cVar2 = *pcVar24;
          (pXVar28->m_tempPool).ptr = pcVar20 + 1;
          *pcVar20 = cVar2;
          cVar2 = *pcVar24;
          pcVar24 = pcVar24 + 1;
        } while (cVar2 != '\0');
      }
      pcVar24 = (pXVar28->m_tempPool).start;
      (pXVar28->m_tempPool).start = (pXVar28->m_tempPool).ptr;
      (&pAVar14->name)[lVar17] = pcVar24;
      pNVar21 = pXVar28->m_nsAtts;
      pNVar21[(int)uVar10].version = uVar31;
      pNVar21[(int)uVar10].hash = uVar19;
      pNVar21[(int)uVar10].uriName = pcVar24;
      iVar13 = iVar13 + -1;
      pXVar38 = parser_00;
      if (iVar13 == 0) {
        lVar17 = lVar17 + 2;
        break;
      }
    }
    else {
      name[-1] = '\0';
    }
  }
LAB_004e03bc:
  for (lVar17 = (long)(int)lVar17; lVar17 < lVar36; lVar17 = lVar17 + 2) {
    (&pAVar14->name)[lVar17][-1] = '\0';
  }
  while (pBVar32 = *bindingsPtr, pBVar32 != (BINDING *)0x0) {
    pBVar32->attId->name[-1] = '\0';
    bindingsPtr = &pBVar32->nextTagBinding;
  }
  if (parser_00->m_ns == '\0') {
    return XML_ERROR_NONE;
  }
  if (elementType->prefix == (PREFIX *)0x0) {
    pBVar32 = (pDVar3->defaultPrefix).binding;
    if (pBVar32 == (BINDING *)0x0) {
      return XML_ERROR_NONE;
    }
    pcVar24 = tagNamePtr->str;
  }
  else {
    pBVar32 = elementType->prefix->binding;
    if (pBVar32 == (BINDING *)0x0) {
      return XML_ERROR_UNBOUND_PREFIX;
    }
    pcVar24 = tagNamePtr->str;
    do {
      cVar2 = *pcVar24;
      pcVar24 = pcVar24 + 1;
    } while (cVar2 != ':');
  }
  lVar17 = 0;
  pXVar16 = pBVar32->prefix->name;
  if ((pXVar38->m_ns_triplets != '\0') && (pXVar16 != (XML_Char *)0x0)) {
    lVar17 = 0;
    do {
      pcVar20 = pXVar16 + lVar17;
      lVar17 = lVar17 + 1;
    } while (*pcVar20 != '\0');
  }
  tagNamePtr->localPart = pcVar24;
  iVar13 = pBVar32->uriLen;
  tagNamePtr->uriLen = iVar13;
  tagNamePtr->prefix = pXVar16;
  uVar33 = (uint)lVar17;
  tagNamePtr->prefixLen = uVar33;
  uVar35 = 0;
  do {
    uVar23 = uVar35;
    uVar35 = uVar23 + 1;
  } while (pcVar24[uVar23] != '\0');
  if (iVar13 <= (int)(uVar33 ^ 0x7fffffff)) {
    iVar27 = (int)uVar35;
    uVar10 = uVar33 + iVar13;
    if (iVar27 - 1U < (uVar10 ^ 0x7fffffff)) {
      if (pBVar32->uriAlloc < (int)(uVar10 + iVar27)) {
        if (0x7fffffe7 < (int)(uVar10 + iVar27)) {
          return XML_ERROR_NO_MEMORY;
        }
        iVar13 = uVar10 + iVar27 + 0x18;
        pXVar16 = (XML_Char *)(*(pXVar38->m_mem).malloc_fcn)((long)iVar13);
        if (pXVar16 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pBVar32->uriAlloc = iVar13;
        memcpy(pXVar16,pBVar32->uri,(long)pBVar32->uriLen);
        pTVar22 = (TAG *)&pXVar38->m_tagStack;
        pXVar6 = pBVar32->uri;
        while (pTVar22 = pTVar22->parent, pTVar22 != (TAG *)0x0) {
          if ((pTVar22->name).str == pXVar6) {
            (pTVar22->name).str = pXVar16;
          }
        }
        (*(pXVar38->m_mem).free_fcn)(pXVar6);
        pBVar32->uri = pXVar16;
        iVar13 = pBVar32->uriLen;
      }
      else {
        pXVar16 = pBVar32->uri;
      }
      pXVar16 = pXVar16 + iVar13;
      memcpy(pXVar16,pcVar24,uVar35 & 0xffffffff);
      if (uVar33 != 0) {
        pXVar16[uVar23] = pXVar38->m_namespaceSeparator;
        memcpy(pXVar16 + uVar35,pBVar32->prefix->name,(long)(int)uVar33);
      }
      tagNamePtr->str = pBVar32->uri;
      return XML_ERROR_NONE;
    }
  }
  return XML_ERROR_NO_MEMORY;
}

Assistant:

static enum XML_Error
storeAtts(XML_Parser parser, const ENCODING *enc, const char *attStr,
          TAG_NAME *tagNamePtr, BINDING **bindingsPtr,
          enum XML_Account account) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  ELEMENT_TYPE *elementType;
  int nDefaultAtts;
  const XML_Char **appAtts; /* the attribute list for the application */
  int attIndex = 0;
  int prefixLen;
  int i;
  int n;
  XML_Char *uri;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  elementType
      = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, tagNamePtr->str, 0);
  if (! elementType) {
    const XML_Char *name = poolCopyString(&dtd->pool, tagNamePtr->str);
    if (! name)
      return XML_ERROR_NO_MEMORY;
    elementType = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, name,
                                         sizeof(ELEMENT_TYPE));
    if (! elementType)
      return XML_ERROR_NO_MEMORY;
    if (parser->m_ns && ! setElementTypePrefix(parser, elementType))
      return XML_ERROR_NO_MEMORY;
  }
  nDefaultAtts = elementType->nDefaultAtts;

  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, parser->m_attsSize, parser->m_atts);

  /* Detect and prevent integer overflow */
  if (n > INT_MAX - nDefaultAtts) {
    return XML_ERROR_NO_MEMORY;
  }

  if (n + nDefaultAtts > parser->m_attsSize) {
    int oldAttsSize = parser->m_attsSize;
    ATTRIBUTE *temp;
#ifdef XML_ATTR_INFO
    XML_AttrInfo *temp2;
#endif

    /* Detect and prevent integer overflow */
    if ((nDefaultAtts > INT_MAX - INIT_ATTS_SIZE)
        || (n > INT_MAX - (nDefaultAtts + INIT_ATTS_SIZE))) {
      return XML_ERROR_NO_MEMORY;
    }

    parser->m_attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;

    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)parser->m_attsSize > (size_t)(-1) / sizeof(ATTRIBUTE)) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
#endif

    temp = (ATTRIBUTE *)REALLOC(parser, (void *)parser->m_atts,
                                parser->m_attsSize * sizeof(ATTRIBUTE));
    if (temp == NULL) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_atts = temp;
#ifdef XML_ATTR_INFO
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#  if UINT_MAX >= SIZE_MAX
    if ((unsigned)parser->m_attsSize > (size_t)(-1) / sizeof(XML_AttrInfo)) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
#  endif

    temp2 = (XML_AttrInfo *)REALLOC(parser, (void *)parser->m_attInfo,
                                    parser->m_attsSize * sizeof(XML_AttrInfo));
    if (temp2 == NULL) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_attInfo = temp2;
#endif
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, parser->m_atts);
  }

  appAtts = (const XML_Char **)parser->m_atts;
  for (i = 0; i < n; i++) {
    ATTRIBUTE *currAtt = &parser->m_atts[i];
#ifdef XML_ATTR_INFO
    XML_AttrInfo *currAttInfo = &parser->m_attInfo[i];
#endif
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId
        = getAttributeId(parser, enc, currAtt->name,
                         currAtt->name + XmlNameLength(enc, currAtt->name));
    if (! attId)
      return XML_ERROR_NO_MEMORY;
#ifdef XML_ATTR_INFO
    currAttInfo->nameStart
        = parser->m_parseEndByteIndex - (parser->m_parseEndPtr - currAtt->name);
    currAttInfo->nameEnd
        = currAttInfo->nameStart + XmlNameLength(enc, currAtt->name);
    currAttInfo->valueStart = parser->m_parseEndByteIndex
                              - (parser->m_parseEndPtr - currAtt->valuePtr);
    currAttInfo->valueEnd = parser->m_parseEndByteIndex
                            - (parser->m_parseEndPtr - currAtt->valueEnd);
#endif
    /* Detect duplicate attributes by their QNames. This does not work when
       namespace processing is turned on and different prefixes for the same
       namespace are used. For this case we have a check further down.
    */
    if ((attId->name)[-1]) {
      if (enc == parser->m_encoding)
        parser->m_eventPtr = parser->m_atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (! parser->m_atts[i].normalized) {
      enum XML_Error result;
      XML_Bool isCdata = XML_TRUE;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(
          parser, enc, isCdata, parser->m_atts[i].valuePtr,
          parser->m_atts[i].valueEnd, &parser->m_tempPool, account);
      if (result)
        return result;
      appAtts[attIndex] = poolStart(&parser->m_tempPool);
      poolFinish(&parser->m_tempPool);
    } else {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&parser->m_tempPool, enc,
                                          parser->m_atts[i].valuePtr,
                                          parser->m_atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&parser->m_tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        enum XML_Error result = addBinding(parser, attId->prefix, attId,
                                           appAtts[attIndex], bindingsPtr);
        if (result)
          return result;
        --attIndex;
      } else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    } else
      attIndex++;
  }

  /* set-up for XML_GetSpecifiedAttributeCount and XML_GetIdAttributeIndex */
  parser->m_nSpecifiedAtts = attIndex;
  if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
    for (i = 0; i < attIndex; i += 2)
      if (appAtts[i] == elementType->idAtt->name) {
        parser->m_idAttIndex = i;
        break;
      }
  } else
    parser->m_idAttIndex = -1;

  /* do attribute defaulting */
  for (i = 0; i < nDefaultAtts; i++) {
    const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + i;
    if (! (da->id->name)[-1] && da->value) {
      if (da->id->prefix) {
        if (da->id->xmlns) {
          enum XML_Error result = addBinding(parser, da->id->prefix, da->id,
                                             da->value, bindingsPtr);
          if (result)
            return result;
        } else {
          (da->id->name)[-1] = 2;
          nPrefixes++;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      } else {
        (da->id->name)[-1] = 1;
        appAtts[attIndex++] = da->id->name;
        appAtts[attIndex++] = da->value;
      }
    }
  }
  appAtts[attIndex] = 0;

  /* expand prefixed attribute names, check for duplicates,
     and clear flags that say whether attributes were specified */
  i = 0;
  if (nPrefixes) {
    int j; /* hash table index */
    unsigned long version = parser->m_nsAttsVersion;

    /* Detect and prevent invalid shift */
    if (parser->m_nsAttsPower >= sizeof(unsigned int) * 8 /* bits per byte */) {
      return XML_ERROR_NO_MEMORY;
    }

    unsigned int nsAttsSize = 1u << parser->m_nsAttsPower;
    unsigned char oldNsAttsPower = parser->m_nsAttsPower;
    /* size of hash table must be at least 2 * (# of prefixed attributes) */
    if ((nPrefixes << 1)
        >> parser->m_nsAttsPower) { /* true for m_nsAttsPower = 0 */
      NS_ATT *temp;
      /* hash table size must also be a power of 2 and >= 8 */
      while (nPrefixes >> parser->m_nsAttsPower++)
        ;
      if (parser->m_nsAttsPower < 3)
        parser->m_nsAttsPower = 3;

      /* Detect and prevent invalid shift */
      if (parser->m_nsAttsPower >= sizeof(nsAttsSize) * 8 /* bits per byte */) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }

      nsAttsSize = 1u << parser->m_nsAttsPower;

      /* Detect and prevent integer overflow.
       * The preprocessor guard addresses the "always false" warning
       * from -Wtype-limits on platforms where
       * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
      if (nsAttsSize > (size_t)(-1) / sizeof(NS_ATT)) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
#endif

      temp = (NS_ATT *)REALLOC(parser, parser->m_nsAtts,
                               nsAttsSize * sizeof(NS_ATT));
      if (! temp) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
      parser->m_nsAtts = temp;
      version = 0; /* force re-initialization of m_nsAtts hash table */
    }
    /* using a version flag saves us from initializing m_nsAtts every time */
    if (! version) { /* initialize version flags when version wraps around */
      version = INIT_ATTS_VERSION;
      for (j = nsAttsSize; j != 0;)
        parser->m_nsAtts[--j].version = version;
    }
    parser->m_nsAttsVersion = --version;

    /* expand prefixed names and check for duplicates */
    for (; i < attIndex; i += 2) {
      const XML_Char *s = appAtts[i];
      if (s[-1] == 2) { /* prefixed */
        ATTRIBUTE_ID *id;
        const BINDING *b;
        unsigned long uriHash;
        struct siphash sip_state;
        struct sipkey sip_key;

        copy_salt_to_sipkey(parser, &sip_key);
        sip24_init(&sip_state, &sip_key);

        ((XML_Char *)s)[-1] = 0; /* clear flag */
        id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, s, 0);
        if (! id || ! id->prefix) {
          /* This code is walking through the appAtts array, dealing
           * with (in this case) a prefixed attribute name.  To be in
           * the array, the attribute must have already been bound, so
           * has to have passed through the hash table lookup once
           * already.  That implies that an entry for it already
           * exists, so the lookup above will return a pointer to
           * already allocated memory.  There is no opportunaity for
           * the allocator to fail, so the condition above cannot be
           * fulfilled.
           *
           * Since it is difficult to be certain that the above
           * analysis is complete, we retain the test and merely
           * remove the code from coverage tests.
           */
          return XML_ERROR_NO_MEMORY; /* LCOV_EXCL_LINE */
        }
        b = id->prefix->binding;
        if (! b)
          return XML_ERROR_UNBOUND_PREFIX;

        for (j = 0; j < b->uriLen; j++) {
          const XML_Char c = b->uri[j];
          if (! poolAppendChar(&parser->m_tempPool, c))
            return XML_ERROR_NO_MEMORY;
        }

        sip24_update(&sip_state, b->uri, b->uriLen * sizeof(XML_Char));

        while (*s++ != XML_T(ASCII_COLON))
          ;

        sip24_update(&sip_state, s, keylen(s) * sizeof(XML_Char));

        do { /* copies null terminator */
          if (! poolAppendChar(&parser->m_tempPool, *s))
            return XML_ERROR_NO_MEMORY;
        } while (*s++);

        uriHash = (unsigned long)sip24_final(&sip_state);

        { /* Check hash table for duplicate of expanded name (uriName).
             Derived from code in lookup(parser, HASH_TABLE *table, ...).
          */
          unsigned char step = 0;
          unsigned long mask = nsAttsSize - 1;
          j = uriHash & mask; /* index into hash table */
          while (parser->m_nsAtts[j].version == version) {
            /* for speed we compare stored hash values first */
            if (uriHash == parser->m_nsAtts[j].hash) {
              const XML_Char *s1 = poolStart(&parser->m_tempPool);
              const XML_Char *s2 = parser->m_nsAtts[j].uriName;
              /* s1 is null terminated, but not s2 */
              for (; *s1 == *s2 && *s1 != 0; s1++, s2++)
                ;
              if (*s1 == 0)
                return XML_ERROR_DUPLICATE_ATTRIBUTE;
            }
            if (! step)
              step = PROBE_STEP(uriHash, mask, parser->m_nsAttsPower);
            j < step ? (j += nsAttsSize - step) : (j -= step);
          }
        }

        if (parser->m_ns_triplets) { /* append namespace separator and prefix */
          parser->m_tempPool.ptr[-1] = parser->m_namespaceSeparator;
          s = b->prefix->name;
          do {
            if (! poolAppendChar(&parser->m_tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
        }

        /* store expanded name in attribute list */
        s = poolStart(&parser->m_tempPool);
        poolFinish(&parser->m_tempPool);
        appAtts[i] = s;

        /* fill empty slot with new version, uriName and hash value */
        parser->m_nsAtts[j].version = version;
        parser->m_nsAtts[j].hash = uriHash;
        parser->m_nsAtts[j].uriName = s;

        if (! --nPrefixes) {
          i += 2;
          break;
        }
      } else                     /* not prefixed */
        ((XML_Char *)s)[-1] = 0; /* clear flag */
    }
  }
  /* clear flags for the remaining attributes */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;

  if (! parser->m_ns)
    return XML_ERROR_NONE;

  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (! binding)
      return XML_ERROR_UNBOUND_PREFIX;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(ASCII_COLON))
      ;
  } else if (dtd->defaultPrefix.binding) {
    binding = dtd->defaultPrefix.binding;
    localPart = tagNamePtr->str;
  } else
    return XML_ERROR_NONE;
  prefixLen = 0;
  if (parser->m_ns_triplets && binding->prefix->name) {
    for (; binding->prefix->name[prefixLen++];)
      ; /* prefixLen includes null terminator */
  }
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  tagNamePtr->prefix = binding->prefix->name;
  tagNamePtr->prefixLen = prefixLen;
  for (i = 0; localPart[i++];)
    ; /* i includes null terminator */

  /* Detect and prevent integer overflow */
  if (binding->uriLen > INT_MAX - prefixLen
      || i > INT_MAX - (binding->uriLen + prefixLen)) {
    return XML_ERROR_NO_MEMORY;
  }

  n = i + binding->uriLen + prefixLen;
  if (n > binding->uriAlloc) {
    TAG *p;

    /* Detect and prevent integer overflow */
    if (n > INT_MAX - EXPAND_SPARE) {
      return XML_ERROR_NO_MEMORY;
    }
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)(n + EXPAND_SPARE) > (size_t)(-1) / sizeof(XML_Char)) {
      return XML_ERROR_NO_MEMORY;
    }
#endif

    uri = (XML_Char *)MALLOC(parser, (n + EXPAND_SPARE) * sizeof(XML_Char));
    if (! uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = parser->m_tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(parser, binding->uri);
    binding->uri = uri;
  }
  /* if m_namespaceSeparator != '\0' then uri includes it already */
  uri = binding->uri + binding->uriLen;
  memcpy(uri, localPart, i * sizeof(XML_Char));
  /* we always have a namespace separator between localPart and prefix */
  if (prefixLen) {
    uri += i - 1;
    *uri = parser->m_namespaceSeparator; /* replace null terminator */
    memcpy(uri + 1, binding->prefix->name, prefixLen * sizeof(XML_Char));
  }
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}